

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver.hpp
# Opt level: O2

Sender<std::vector<std::__cxx11::basic_string<char>_>_> __thiscall
ftxui::
ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::MakeSender(ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *this)

{
  int *piVar1;
  undefined8 *puVar2;
  mutex_type *in_RSI;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,in_RSI);
  LOCK();
  piVar1 = &in_RSI[4].super___mutex_base._M_mutex.__data.__owner;
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  puVar2 = (undefined8 *)operator_new(8);
  *puVar2 = in_RSI;
  *(undefined8 **)&(this->mutex_).super___mutex_base._M_mutex = puVar2;
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return (__uniq_ptr_data<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_true>
          )(__uniq_ptr_data<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<ftxui::SenderImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true,_true>
            )this;
}

Assistant:

Sender<T> MakeSender() {
    std::unique_lock<std::mutex> lock(mutex_);
    senders_++;
    return std::unique_ptr<SenderImpl<T>>(new SenderImpl<T>(this));
  }